

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qboxlayout.cpp
# Opt level: O1

void __thiscall QBoxLayoutPrivate::setupGeom(QBoxLayoutPrivate *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  Direction DVar5;
  QLayout *this_00;
  qsizetype qVar6;
  QBoxLayoutItem *this_01;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  QFlagsStorage<QSizePolicy::ControlType> QVar16;
  int iVar17;
  Representation RVar18;
  Representation RVar19;
  uint uVar20;
  QStyle *this_02;
  uint extraout_var;
  uint extraout_var_00;
  uint extraout_var_01;
  QWidget *pQVar21;
  undefined4 extraout_var_02;
  pointer pQVar22;
  bool bVar23;
  QFlagsStorage<QSizePolicy::ControlType> controls2;
  uint uVar24;
  uint uVar25;
  ulong uVar26;
  uint uVar27;
  byte bVar28;
  uint uVar29;
  ulong uVar30;
  long lVar31;
  long in_FS_OFFSET;
  bool bVar32;
  bool bVar33;
  int iVar34;
  QSize QVar35;
  uint local_100;
  uint local_fc;
  QFlagsStorage<QSizePolicy::ControlType> local_e8;
  uint local_e4;
  QSize local_c8;
  QArrayDataPointer<QLayoutStruct> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->field_0x118 & 2) != 0) {
    this_00 = *(QLayout **)&(this->super_QLayoutPrivate).field_0x8;
    uVar29 = 0;
    bVar32 = this->dir < Down;
    local_c8.wd.m_i = 0x7ffff;
    local_c8.ht.m_i = 0;
    if (bVar32) {
      local_c8.wd.m_i = 0;
      local_c8.ht.m_i = 0;
    }
    uVar20 = 0x7ffff;
    if (!bVar32) {
      uVar20 = 0;
    }
    qVar6 = (this->list).d.size;
    this->field_0x118 = this->field_0x118 & 0xfe;
    QList<QLayoutStruct>::clear(&this->geomArray);
    uVar27 = (uint)qVar6;
    local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.ptr = (QLayoutStruct *)&DAT_aaaaaaaaaaaaaaaa;
    QList<QLayoutStruct>::QList((QList<QLayoutStruct> *)&local_58,(long)(int)uVar27);
    iVar10 = (**(code **)(*(long *)this_00 + 0x60))(this_00);
    if ((iVar10 < 0) && (pQVar21 = QLayout::parentWidget(this_00), pQVar21 != (QWidget *)0x0)) {
      this_02 = QWidget::style(pQVar21);
    }
    else {
      this_02 = (QStyle *)0x0;
    }
    if ((int)uVar27 < 1) {
      uVar27 = 0;
      local_fc = 0;
      local_100 = 0;
      uVar26 = 0;
      uVar30 = 0;
    }
    else {
      uVar29 = 0xffffffff;
      lVar31 = 0;
      uVar30 = 0;
      local_e4 = 0;
      uVar25 = 0;
      local_100 = 0;
      local_fc = 0;
      bVar8 = 0;
      bVar9 = 0;
      local_e8.i = 0;
      do {
        this_01 = *(QBoxLayoutItem **)((long)(this->list).d.ptr + lVar31);
        uVar11 = (*this_01->item->_vptr_QLayoutItem[4])();
        uVar12 = (*this_01->item->_vptr_QLayoutItem[3])();
        uVar13 = (*this_01->item->_vptr_QLayoutItem[2])();
        uVar14 = (*this_01->item->_vptr_QLayoutItem[5])();
        iVar15 = (*this_01->item->_vptr_QLayoutItem[8])();
        bVar32 = SUB41(iVar15,0);
        if (bVar32 == false) {
          if (iVar10 < 0) {
            QVar16.i = (*this_01->item->_vptr_QLayoutItem[0x10])();
            if ((int)uVar29 < 0) {
              iVar15 = 0;
            }
            else {
              DVar5 = this->dir;
              controls2.i = QVar16.i;
              if ((DVar5 | Down) == BottomToTop) {
                controls2.i = local_e8.i;
                local_e8.i = QVar16.i;
              }
              iVar15 = 0;
              if (this_02 != (QStyle *)0x0) {
                pQVar21 = QLayout::parentWidget(this_00);
                iVar15 = QStyle::combinedLayoutSpacing
                                   (this_02,(ControlTypes)local_e8.i,(ControlTypes)controls2.i,
                                    Vertical - (DVar5 < Down),(QStyleOption *)0x0,pQVar21);
                if (iVar15 < 1) {
                  iVar15 = 0;
                }
              }
            }
          }
          else {
            iVar15 = iVar10;
            QVar16.i = local_e8.i;
            if ((int)uVar29 < 0) {
              iVar15 = 0;
            }
          }
          local_e8.i = QVar16.i;
          if (-1 < (int)uVar29) {
            pQVar22 = QList<QLayoutStruct>::data((QList<QLayoutStruct> *)&local_58);
            pQVar22[uVar29].spacing = iVar15;
          }
          uVar29 = (uint)uVar30;
        }
        else {
          iVar15 = 0;
        }
        if (bVar32 == false) {
          bVar33 = false;
        }
        else {
          iVar17 = (*this_01->item->_vptr_QLayoutItem[0xd])();
          bVar33 = CONCAT44(extraout_var_02,iVar17) != 0;
        }
        bVar23 = true;
        bVar28 = (byte)uVar14;
        RVar18 = local_c8.wd.m_i;
        if (this->dir < Down) {
          if ((uVar14 & 1) == 0) {
            bVar23 = 0 < this_01->stretch;
          }
          if (!bVar33) {
            iVar17 = (*this_01->item->_vptr_QLayoutItem[8])();
            if (bVar9 == 0) {
              bVar7 = (byte)iVar17 ^ 1;
              uVar24 = extraout_var;
              if ((((uVar20 != 0 && bVar7 == 0) && (char)((uVar14 & 2) >> 1) == '\0') &&
                  (uVar24 = uVar20, bVar7 == 0)) &&
                 (uVar24 = extraout_var, (int)uVar20 < (int)extraout_var)) {
                uVar24 = uVar20;
              }
            }
            else {
              uVar24 = uVar20;
              if (((uVar14 & 2) != 0) && (uVar24 = extraout_var, (int)extraout_var < (int)uVar20)) {
                uVar24 = uVar20;
              }
            }
            bVar9 = bVar28 >> 1 & 1 | bVar9;
            uVar20 = uVar24;
          }
          bVar8 = bVar8 | bVar23;
          local_c8.wd.m_i = RVar18.m_i + uVar11 + iVar15;
          local_c8.ht.m_i = 0;
          local_e4 = local_e4 + uVar12 + iVar15;
          local_100 = local_100 + uVar13 + iVar15;
          if ((int)uVar25 <= (int)extraout_var_00) {
            uVar25 = extraout_var_00;
          }
          if ((int)local_fc <= (int)extraout_var_01) {
            local_fc = extraout_var_01;
          }
          pQVar22 = QList<QLayoutStruct>::data((QList<QLayoutStruct> *)&local_58);
          (&pQVar22->sizeHint)[lVar31] = uVar13;
          pQVar22 = QList<QLayoutStruct>::data((QList<QLayoutStruct> *)&local_58);
          (&pQVar22->maximumSize)[lVar31] = uVar11;
          pQVar22 = QList<QLayoutStruct>::data((QList<QLayoutStruct> *)&local_58);
          (&pQVar22->minimumSize)[lVar31] = uVar12;
          pQVar22 = QList<QLayoutStruct>::data((QList<QLayoutStruct> *)&local_58);
          (&pQVar22->expansive)[lVar31 * 4] = bVar23;
          iVar15 = this_01->stretch;
          if (iVar15 == 0) {
            iVar15 = QBoxLayoutItem::hStretch(this_01);
          }
        }
        else {
          if ((uVar14 & 2) == 0) {
            bVar23 = 0 < this_01->stretch;
          }
          if (!bVar33) {
            iVar17 = (*this_01->item->_vptr_QLayoutItem[8])();
            if (bVar8 == 0) {
              bVar7 = (byte)iVar17 ^ 1;
              RVar19.m_i = uVar11;
              if (((RVar18.m_i == 0U | bVar28 | bVar7) & 1) != 0) goto LAB_002ca197;
              if (bVar7 == 0) {
                if ((int)uVar11 <= RVar18.m_i) {
                  RVar18.m_i = uVar11;
                }
                local_c8.ht.m_i = 0;
                local_c8.wd.m_i = RVar18.m_i;
              }
            }
            else {
              RVar19.m_i = RVar18.m_i;
              if (((uVar14 & 1) != 0) && (RVar18.m_i <= (int)uVar11)) {
                RVar19.m_i = uVar11;
              }
LAB_002ca197:
              local_c8.ht.m_i = 0;
              local_c8.wd.m_i = RVar19.m_i;
            }
            bVar8 = bVar8 | bVar28 & 1;
          }
          bVar9 = bVar9 | bVar23;
          uVar20 = uVar20 + extraout_var + iVar15;
          uVar25 = uVar25 + extraout_var_00 + iVar15;
          local_fc = local_fc + extraout_var_01 + iVar15;
          if ((int)local_e4 <= (int)uVar12) {
            local_e4 = uVar12;
          }
          if ((int)local_100 <= (int)uVar13) {
            local_100 = uVar13;
          }
          pQVar22 = QList<QLayoutStruct>::data((QList<QLayoutStruct> *)&local_58);
          (&pQVar22->sizeHint)[lVar31] = extraout_var_01;
          pQVar22 = QList<QLayoutStruct>::data((QList<QLayoutStruct> *)&local_58);
          (&pQVar22->maximumSize)[lVar31] = extraout_var;
          pQVar22 = QList<QLayoutStruct>::data((QList<QLayoutStruct> *)&local_58);
          (&pQVar22->minimumSize)[lVar31] = extraout_var_00;
          pQVar22 = QList<QLayoutStruct>::data((QList<QLayoutStruct> *)&local_58);
          (&pQVar22->expansive)[lVar31 * 4] = bVar23;
          iVar15 = this_01->stretch;
          if (iVar15 == 0) {
            iVar15 = QBoxLayoutItem::vStretch(this_01);
          }
        }
        pQVar22 = QList<QLayoutStruct>::data((QList<QLayoutStruct> *)&local_58);
        (&pQVar22->stretch)[lVar31] = iVar15;
        pQVar22 = QList<QLayoutStruct>::data((QList<QLayoutStruct> *)&local_58);
        (&pQVar22->empty)[lVar31 * 4] = bVar32;
        pQVar22 = QList<QLayoutStruct>::data((QList<QLayoutStruct> *)&local_58);
        (&pQVar22->spacing)[lVar31] = 0;
        bVar28 = 1;
        if ((this->field_0x118 & 1) == 0) {
          iVar15 = (*this_01->item->_vptr_QLayoutItem[9])();
          bVar28 = (byte)iVar15;
        }
        this->field_0x118 = this->field_0x118 & 0xfe | bVar28;
        uVar30 = uVar30 + 1;
        lVar31 = lVar31 + 8;
      } while ((uVar27 & 0x7fffffff) != uVar30);
      uVar27 = (uint)bVar8;
      uVar29 = (uint)bVar9 * 2;
      uVar26 = (ulong)uVar25 << 0x20;
      uVar30 = (ulong)local_e4;
    }
    QArrayDataPointer<QLayoutStruct>::operator=(&(this->geomArray).d,&local_58);
    (this->expanding).super_QFlagsStorageHelper<Qt::Orientation,_4>.
    super_QFlagsStorage<Qt::Orientation>.i = uVar29 | uVar27;
    this->minSize = (QSize)(uVar26 | uVar30);
    uVar29 = (uint)uVar30;
    if (local_c8.wd.m_i.m_i <= (int)uVar29) {
      local_c8 = (QSize)(uVar26 | uVar30);
    }
    uVar27 = (this->minSize).ht.m_i;
    if ((int)uVar20 <= (int)uVar27) {
      uVar20 = uVar27;
    }
    if ((int)uVar29 < (int)local_100) {
      uVar29 = local_100;
    }
    if ((int)uVar27 < (int)local_fc) {
      uVar27 = local_fc;
    }
    this->maxSize = (QSize)(((ulong)uVar20 << 0x20) + ((ulong)local_c8 & 0xffffffff));
    uVar30 = (ulong)uVar29;
    if (local_c8.wd.m_i.m_i <= (int)uVar29) {
      uVar30 = (ulong)local_c8 & 0xffffffff;
    }
    uVar29 = (this->maxSize).ht.m_i;
    if ((int)uVar29 <= (int)uVar27) {
      uVar27 = uVar29;
    }
    this->sizeHint = (QSize)(uVar30 | (ulong)uVar27 << 0x20);
    QLayout::getContentsMargins
              (this_00,&this->leftMargin,&this->topMargin,&this->rightMargin,&this->bottomMargin);
    uVar1 = this->rightMargin;
    uVar3 = this->bottomMargin;
    uVar2 = this->leftMargin;
    uVar4 = this->topMargin;
    iVar17 = uVar2 + uVar1;
    iVar34 = uVar4 + uVar3;
    QVar35.wd.m_i = (this->maxSize).wd.m_i + iVar17;
    QVar35.ht.m_i = (this->maxSize).ht.m_i + iVar34;
    this->maxSize = QVar35;
    iVar10 = (this->minSize).wd.m_i;
    iVar15 = (this->minSize).ht.m_i;
    (this->sizeHint).wd.m_i = (this->sizeHint).wd.m_i + iVar17;
    (this->sizeHint).ht.m_i = (this->sizeHint).ht.m_i + iVar34;
    (this->minSize).wd.m_i = iVar10 + iVar17;
    (this->minSize).ht.m_i = iVar15 + iVar34;
    this->field_0x118 = this->field_0x118 & 0xfd;
    if (&(local_58.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d)->super_QArrayData,0x20,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QBoxLayoutPrivate::setupGeom()
{
    if (!dirty)
        return;

    Q_Q(QBoxLayout);
    int maxw = horz(dir) ? 0 : QLAYOUTSIZE_MAX;
    int maxh = horz(dir) ? QLAYOUTSIZE_MAX : 0;
    int minw = 0;
    int minh = 0;
    int hintw = 0;
    int hinth = 0;

    bool horexp = false;
    bool verexp = false;

    hasHfw = false;

    int n = list.size();
    geomArray.clear();
    QList<QLayoutStruct> a(n);

    QSizePolicy::ControlTypes controlTypes1;
    QSizePolicy::ControlTypes controlTypes2;
    int fixedSpacing = q->spacing();
    int previousNonEmptyIndex = -1;

    QStyle *style = nullptr;
    if (fixedSpacing < 0) {
        if (QWidget *parentWidget = q->parentWidget())
            style = parentWidget->style();
    }

    for (int i = 0; i < n; i++) {
        QBoxLayoutItem *box = list.at(i);
        QSize max = box->item->maximumSize();
        QSize min = box->item->minimumSize();
        QSize hint = box->item->sizeHint();
        Qt::Orientations exp = box->item->expandingDirections();
        bool empty = box->item->isEmpty();
        int spacing = 0;

        if (!empty) {
            if (fixedSpacing >= 0) {
                spacing = (previousNonEmptyIndex >= 0) ? fixedSpacing : 0;
#ifdef Q_OS_MAC
                if (!horz(dir) && previousNonEmptyIndex >= 0) {
                    QBoxLayoutItem *sibling = (dir == QBoxLayout::TopToBottom  ? box : list.at(previousNonEmptyIndex));
                    if (sibling) {
                        QWidget *wid = sibling->item->widget();
                        if (wid)
                            spacing = qMax(spacing, sibling->item->geometry().top() - wid->geometry().top());
                    }
                }
#endif
            } else {
                controlTypes1 = controlTypes2;
                controlTypes2 = box->item->controlTypes();
                if (previousNonEmptyIndex >= 0) {
                    QSizePolicy::ControlTypes actual1 = controlTypes1;
                    QSizePolicy::ControlTypes actual2 = controlTypes2;
                    if (dir == QBoxLayout::RightToLeft || dir == QBoxLayout::BottomToTop)
                        qSwap(actual1, actual2);

                    if (style) {
                        spacing = style->combinedLayoutSpacing(actual1, actual2,
                                             horz(dir) ? Qt::Horizontal : Qt::Vertical,
                                             nullptr, q->parentWidget());
                        if (spacing < 0)
                            spacing = 0;
                    }
                }
            }

            if (previousNonEmptyIndex >= 0)
                a[previousNonEmptyIndex].spacing = spacing;
            previousNonEmptyIndex = i;
        }

        bool ignore = empty && box->item->widget(); // ignore hidden widgets
        bool dummy = true;
        if (horz(dir)) {
            bool expand = (exp & Qt::Horizontal || box->stretch > 0);
            horexp = horexp || expand;
            maxw += spacing + max.width();
            minw += spacing + min.width();
            hintw += spacing + hint.width();
            if (!ignore)
                qMaxExpCalc(maxh, verexp, dummy,
                            max.height(), exp & Qt::Vertical, box->item->isEmpty());
            minh = qMax(minh, min.height());
            hinth = qMax(hinth, hint.height());

            a[i].sizeHint = hint.width();
            a[i].maximumSize = max.width();
            a[i].minimumSize = min.width();
            a[i].expansive = expand;
            a[i].stretch = box->stretch ? box->stretch : box->hStretch();
        } else {
            bool expand = (exp & Qt::Vertical || box->stretch > 0);
            verexp = verexp || expand;
            maxh += spacing + max.height();
            minh += spacing + min.height();
            hinth += spacing + hint.height();
            if (!ignore)
                qMaxExpCalc(maxw, horexp, dummy,
                            max.width(), exp & Qt::Horizontal, box->item->isEmpty());
            minw = qMax(minw, min.width());
            hintw = qMax(hintw, hint.width());

            a[i].sizeHint = hint.height();
            a[i].maximumSize = max.height();
            a[i].minimumSize = min.height();
            a[i].expansive = expand;
            a[i].stretch = box->stretch ? box->stretch : box->vStretch();
        }

        a[i].empty = empty;
        a[i].spacing = 0;   // might be initialized with a non-zero value in a later iteration
        hasHfw = hasHfw || box->item->hasHeightForWidth();
    }

    geomArray = a;

    expanding = (Qt::Orientations)
                       ((horexp ? Qt::Horizontal : 0)
                         | (verexp ? Qt::Vertical : 0));

    minSize = QSize(minw, minh);
    maxSize = QSize(maxw, maxh).expandedTo(minSize);
    sizeHint = QSize(hintw, hinth).expandedTo(minSize).boundedTo(maxSize);

    q->getContentsMargins(&leftMargin, &topMargin, &rightMargin, &bottomMargin);
    int left, top, right, bottom;
    effectiveMargins(&left, &top, &right, &bottom);
    QSize extra(left + right, top + bottom);

    minSize += extra;
    maxSize += extra;
    sizeHint += extra;

    dirty = false;
}